

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * NewToken(TidyDocImpl *doc,NodeType type)

{
  Lexer *lexer;
  uint uVar1;
  Node *pNVar2;
  
  lexer = doc->lexer;
  pNVar2 = prvTidyNewNode(lexer->allocator,lexer);
  pNVar2->type = type;
  uVar1 = lexer->txtend;
  pNVar2->start = lexer->txtstart;
  pNVar2->end = uVar1;
  return pNVar2;
}

Assistant:

static Node* NewToken(TidyDocImpl* doc, NodeType type)
{
    Lexer* lexer = doc->lexer;
    Node* node = TY_(NewNode)(lexer->allocator, lexer);
    node->type = type;
    node->start = lexer->txtstart;
    node->end = lexer->txtend;
    return node;
}